

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppTest.cpp
# Opt level: O0

void __thiscall TApp_FileNotExists_Test::TestBody(TApp_FileNotExists_Test *this)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar1;
  Option *this_00;
  char *pcVar2;
  undefined8 uVar3;
  long *plVar4;
  char *in_R9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_4c0;
  string local_468;
  AssertHelper local_448;
  Message local_440;
  string local_438;
  bool local_411;
  undefined1 local_410 [8];
  AssertionResult gtest_ar__1;
  Message local_3f8 [2];
  ValidationError *anon_var_0;
  char *pcStack_3e0;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  AssertHelper local_3b8;
  Message local_3b0;
  undefined1 local_3a8 [8];
  AssertionResult gtest_ar_;
  bool local_191;
  bool ok;
  Message local_188;
  undefined1 local_180 [8];
  AssertionResult gtest_ar;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  string local_140 [32];
  iterator local_120;
  size_type local_118;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_110;
  allocator local_e9;
  string local_e8;
  allocator local_c1;
  string local_c0;
  undefined1 local_a0 [8];
  string filename;
  Message local_78 [2];
  string local_68;
  allocator local_31;
  undefined1 local_30 [8];
  string myfile;
  TApp_FileNotExists_Test *this_local;
  
  myfile.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_30,"TestNonFileNotUsed.txt",&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      CLI::NonexistentPath(&local_68,(string *)local_30);
      std::__cxx11::string::~string((string *)&local_68);
    }
  }
  else {
    testing::Message::Message(local_78);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)((long)&filename.field_2 + 8),kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
               ,0x2ee,
               "Expected: CLI::NonexistentPath(myfile) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)((long)&filename.field_2 + 8),local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)((long)&filename.field_2 + 8));
    testing::Message::~Message(local_78);
  }
  std::__cxx11::string::string((string *)local_a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_c0,"--file",&local_c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_e8,"",&local_e9);
  this_00 = CLI::App::
            add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                      (&(this->super_TApp).app,&local_c0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0
                       ,&local_e8);
  std::function<std::__cxx11::string(std::__cxx11::string_const&)>::
  function<std::__cxx11::string(&)(std::__cxx11::string_const&),void>
            ((function<std::__cxx11::string(std::__cxx11::string_const&)> *)&local_110,
             CLI::NonexistentPath);
  CLI::Option::check(this_00,&local_110);
  CLI::std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_110);
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_e9);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  gtest_ar.message_.ptr_._6_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_160,"--file",(allocator *)((long)&gtest_ar.message_.ptr_ + 7));
  std::__cxx11::string::string(local_140,(string *)local_30);
  gtest_ar.message_.ptr_._6_1_ = 0;
  local_120 = &local_160;
  local_118 = 2;
  __l._M_len = 2;
  __l._M_array = local_120;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->super_TApp).args,__l);
  local_4c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_120;
  do {
    local_4c0 = local_4c0 + -1;
    std::__cxx11::string::~string((string *)local_4c0);
  } while (local_4c0 != &local_160);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar.message_.ptr_ + 7));
  TApp::run(&this->super_TApp);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_180,"myfile","filename",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_180);
  if (!bVar1) {
    testing::Message::Message(&local_188);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_180);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffffe70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
               ,0x2f5,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&stack0xfffffffffffffe70,&local_188);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffe70);
    testing::Message::~Message(&local_188);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_180);
  CLI::App::reset(&(this->super_TApp).app);
  uVar3 = std::__cxx11::string::c_str();
  std::ofstream::ofstream(&gtest_ar_.message_,uVar3,0x10);
  plVar4 = (long *)std::ostream::put((char)&gtest_ar_ + '\b');
  bVar1 = std::ios::operator_cast_to_bool((ios *)((long)plVar4 + *(long *)(*plVar4 + -0x18)));
  std::ofstream::~ofstream(&gtest_ar_.message_);
  local_191 = bVar1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_3a8,&local_191,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3a8);
  if (!bVar1) {
    testing::Message::Message(&local_3b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_msg,(internal *)local_3a8,(AssertionResult *)"ok","false","true",
               in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_3b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
               ,0x2fa,pcVar2);
    testing::internal::AssertHelper::operator=(&local_3b8,&local_3b0);
    testing::internal::AssertHelper::~AssertHelper(&local_3b8);
    std::__cxx11::string::~string((string *)&gtest_msg);
    testing::Message::~Message(&local_3b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3a8);
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xfffffffffffffc20,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xfffffffffffffc20);
  if (bVar1) {
    anon_var_0._7_1_ = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      TApp::run(&this->super_TApp);
    }
    if ((anon_var_0._7_1_ & 1) != 0) goto LAB_0013a5d9;
    pcStack_3e0 = 
    "Expected: run() throws an exception of type CLI::ValidationError.\n  Actual: it throws nothing."
    ;
  }
  testing::Message::Message(local_3f8);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&gtest_ar__1.message_,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
             ,0x2fb,pcStack_3e0);
  testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__1.message_,local_3f8);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1.message_);
  testing::Message::~Message(local_3f8);
LAB_0013a5d9:
  pcVar2 = (char *)std::__cxx11::string::c_str();
  remove(pcVar2);
  CLI::ExistingFile(&local_438,(string *)local_30);
  local_411 = (bool)std::__cxx11::string::empty();
  local_411 = (bool)(local_411 ^ 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_410,&local_411,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_438);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_410);
  if (!bVar1) {
    testing::Message::Message(&local_440);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_468,(internal *)local_410,
               (AssertionResult *)"CLI::ExistingFile(myfile).empty()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_448,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
               ,0x2fe,pcVar2);
    testing::internal::AssertHelper::operator=(&local_448,&local_440);
    testing::internal::AssertHelper::~AssertHelper(&local_448);
    std::__cxx11::string::~string((string *)&local_468);
    testing::Message::~Message(&local_440);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_410);
  std::__cxx11::string::~string((string *)local_a0);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

TEST_F(TApp, FileNotExists) {
    std::string myfile{"TestNonFileNotUsed.txt"};
    EXPECT_NO_THROW(CLI::NonexistentPath(myfile));

    std::string filename;
    app.add_option("--file", filename)->check(CLI::NonexistentPath);
    args = {"--file", myfile};

    run();
    EXPECT_EQ(myfile, filename);

    app.reset();

    bool ok = static_cast<bool>(std::ofstream(myfile.c_str()).put('a')); // create file
    EXPECT_TRUE(ok);
    EXPECT_THROW(run(), CLI::ValidationError);

    std::remove(myfile.c_str());
    EXPECT_FALSE(CLI::ExistingFile(myfile).empty());
}